

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_dataview_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  list_head *plVar1;
  int64_t iVar2;
  JSValue ctor;
  bool bVar3;
  int iVar4;
  JSArrayBuffer *pJVar5;
  JSValueUnion JVar6;
  list_head *plVar7;
  int64_t iVar8;
  JSValue JVar9;
  JSValue JVar10;
  uint64_t l;
  uint64_t offset;
  JSValueUnion local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  uint64_t local_50;
  ulong local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = new_target.tag;
  local_40 = new_target.u;
  plVar1 = (list_head *)(argv->u).ptr;
  iVar2 = argv->tag;
  pJVar5 = js_get_array_buffer(ctx,*argv);
  if ((pJVar5 == (JSArrayBuffer *)0x0) ||
     ((local_50 = 0, 1 < argc && (iVar4 = JS_ToIndex(ctx,&local_50,argv[1]), iVar4 != 0)))) {
    iVar8 = 6;
    local_58.float64 = 0.0;
    goto LAB_00134106;
  }
  if (pJVar5->detached == '\0') {
    if ((ulong)(long)pJVar5->byte_length < local_50) {
      JS_ThrowRangeError(ctx,"invalid byteOffset");
    }
    else {
      local_60._0_4_ = pJVar5->byte_length - (int)local_50;
      local_60._4_4_ = 0;
      local_48 = local_50;
      if ((2 < argc) && ((int)argv[2].tag != 3)) {
        JVar9.tag = argv[2].tag;
        JVar9.u.ptr = argv[2].u.ptr;
        iVar4 = JS_ToIndex(ctx,(uint64_t *)&local_68.int32,JVar9);
        if (iVar4 == 0) {
          if ((local_60.ptr & 0xffffffffU) < (ulong)local_68) {
            bVar3 = false;
            JS_ThrowRangeError(ctx,"invalid byteLength");
          }
          else {
            bVar3 = true;
            local_60.float64 = local_68.float64;
          }
        }
        else {
          bVar3 = false;
        }
        if (!bVar3) goto LAB_00134101;
      }
      ctor.tag = local_38;
      ctor.u.float64 = local_40.float64;
      JVar9 = js_create_from_ctor(ctx,ctor,0x1e);
      iVar8 = JVar9.tag;
      JVar6 = JVar9.u;
      if ((uint)JVar9.tag != 6) {
        local_58 = JVar6;
        if (pJVar5->detached == '\0') {
          plVar7 = (list_head *)js_malloc(ctx,0x28);
          if (plVar7 != (list_head *)0x0) {
            ((JSValueUnion *)(plVar7 + 1))->ptr = (void *)local_58;
            if (0xfffffff4 < (uint)iVar2) {
              *(int *)&plVar1->prev = *(int *)&plVar1->prev + 1;
            }
            plVar7[1].next = plVar1;
            *(int *)&plVar7[2].prev = (int)local_48;
            *(int32_t *)((long)&plVar7[2].prev + 4) = local_60.int32;
            plVar1 = (pJVar5->array_list).prev;
            plVar1->next = plVar7;
            plVar7->prev = plVar1;
            plVar7->next = &pJVar5->array_list;
            (pJVar5->array_list).prev = plVar7;
            *(list_head **)((long)local_58.ptr + 0x30) = plVar7;
            goto LAB_00134106;
          }
        }
        else {
          JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        }
        if ((0xfffffff4 < (uint)JVar9.tag) &&
           (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
          local_68 = JVar6;
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
  }
LAB_00134101:
  local_58.float64 = 0.0;
  iVar8 = 6;
LAB_00134106:
  JVar10.tag = iVar8;
  JVar10.u.float64 = local_58.float64;
  return JVar10;
}

Assistant:

static JSValue js_dataview_constructor(JSContext *ctx,
                                       JSValueConst new_target,
                                       int argc, JSValueConst *argv)
{
    JSArrayBuffer *abuf;
    uint64_t offset;
    uint32_t len;
    JSValueConst buffer;
    JSValue obj;
    JSTypedArray *ta;
    JSObject *p;

    buffer = argv[0];
    abuf = js_get_array_buffer(ctx, buffer);
    if (!abuf)
        return JS_EXCEPTION;
    offset = 0;
    if (argc > 1) {
        if (JS_ToIndex(ctx, &offset, argv[1]))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    if (offset > abuf->byte_length)
        return JS_ThrowRangeError(ctx, "invalid byteOffset");
    len = abuf->byte_length - offset;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        uint64_t l;
        if (JS_ToIndex(ctx, &l, argv[2]))
            return JS_EXCEPTION;
        if (l > len)
            return JS_ThrowRangeError(ctx, "invalid byteLength");
        len = l;
    }

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_DATAVIEW);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    if (abuf->detached) {
        /* could have been detached in js_create_from_ctor() */
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
    fail:
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ta->obj = p;
    ta->buffer = JS_VALUE_GET_OBJ(JS_DupValue(ctx, buffer));
    ta->offset = offset;
    ta->length = len;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    return obj;
}